

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O3

char * duckdb_appender_error(duckdb_appender appender)

{
  if ((appender != (duckdb_appender)0x0) && (*(long *)(appender + 0x10) != 0)) {
    return *(char **)(appender + 8);
  }
  return (char *)0x0;
}

Assistant:

const char *duckdb_appender_error(duckdb_appender appender) {
	if (!appender) {
		return nullptr;
	}
	auto wrapper = reinterpret_cast<AppenderWrapper *>(appender);
	if (wrapper->error.empty()) {
		return nullptr;
	}
	return wrapper->error.c_str();
}